

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

XmlReaderPtr __thiscall
Assimp::Ogre::OgreXmlSerializer::OpenReader
          (OgreXmlSerializer *this,IOSystem *pIOHandler,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  IOStream *_stream;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *__p;
  Logger *pLVar4;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  XmlReaderPtr XVar7;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,".skeleton.xml","");
  bVar2 = EndsWith(filename,local_1a8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    iVar3 = (*pIOHandler->_vptr_IOSystem[2])(pIOHandler,(filename->_M_dataplus)._M_p);
    if ((char)iVar3 != '\0') {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
      iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                        (pIOHandler,(filename->_M_dataplus)._M_p,local_1a8[0]._M_dataplus._M_p);
      _stream = (IOStream *)CONCAT44(extraout_var,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (_stream == (IOStream *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a8,"Failed to open skeleton file ",filename);
        std::runtime_error::runtime_error(prVar5,(string *)local_1a8);
        *(undefined ***)prVar5 = &PTR__runtime_error_008bf448;
        __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
      CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
      __p = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
      this->m_reader = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_currentNodeName,__p);
      if (this->m_reader == (XmlReader *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a8,"Failed to create XML reader for skeleton file ",filename);
        std::runtime_error::runtime_error(prVar5,(string *)local_1a8);
        *(undefined ***)prVar5 = &PTR__runtime_error_008bf448;
        __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
      (*_stream->_vptr_IOStream[1])(_stream);
      _Var6._M_pi = extraout_RDX;
      goto LAB_0046f0d8;
    }
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[31]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [31])"Failed to find skeleton file \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\' that is referenced by imported Mesh.",0x26);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,(char *)local_1c8);
  }
  else {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [46])"Imported Mesh is referencing to unsupported \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\' skeleton file.",0x10);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,(char *)local_1c8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  this->m_reader = (XmlReader *)0x0;
  (this->m_currentNodeName)._M_dataplus._M_p = (pointer)0x0;
  _Var6._M_pi = extraout_RDX_00;
LAB_0046f0d8:
  XVar7.
  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  XVar7.
  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (XmlReaderPtr)
         XVar7.
         super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

XmlReaderPtr OgreXmlSerializer::OpenReader(Assimp::IOSystem *pIOHandler, const std::string &filename)
{
    if (!EndsWith(filename, ".skeleton.xml", false))
    {
        ASSIMP_LOG_ERROR_F("Imported Mesh is referencing to unsupported '", filename, "' skeleton file.");
        return XmlReaderPtr();
    }

    if (!pIOHandler->Exists(filename))
    {
        ASSIMP_LOG_ERROR_F("Failed to find skeleton file '", filename, "' that is referenced by imported Mesh.");
        return XmlReaderPtr();
    }

    std::unique_ptr<IOStream> file(pIOHandler->Open(filename));
    if (!file.get()) {
        throw DeadlyImportError("Failed to open skeleton file " + filename);
    }

    std::unique_ptr<CIrrXML_IOStreamReader> stream(new CIrrXML_IOStreamReader(file.get()));
    XmlReaderPtr reader = XmlReaderPtr(irr::io::createIrrXMLReader(stream.get()));
    if (!reader.get()) {
        throw DeadlyImportError("Failed to create XML reader for skeleton file " + filename);
    }
    return reader;
}